

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaBasicItemPtr
xmlSchemaFindRedefCompInGraph
          (xmlSchemaBucketPtr_conflict bucket,xmlSchemaTypeType type,xmlChar *name,xmlChar *nsName)

{
  void **ppvVar1;
  void **ppvVar2;
  xmlSchemaBucketPtr_conflict bucket_00;
  bool bVar3;
  void ***pppvVar4;
  xmlSchemaItemListPtr pxVar5;
  long lVar6;
  xmlSchemaSchemaRelationPtr_conflict rel;
  xmlSchemaSchemaRelationPtr_conflict pxVar7;
  
  if (name != (xmlChar *)0x0 && bucket != (xmlSchemaBucketPtr_conflict)0x0) {
    pxVar5 = bucket->globals;
    if ((pxVar5 != (xmlSchemaItemListPtr)0x0) &&
       (ppvVar1 = (void **)&pxVar5->nbItems, 0 < (long)*(int *)ppvVar1)) {
      pppvVar4 = &pxVar5->items;
      lVar6 = 0;
      do {
        pxVar5 = (xmlSchemaItemListPtr)(*pppvVar4)[lVar6];
        if (*(xmlSchemaTypeType *)&pxVar5->items == type) {
          if (type - XML_SCHEMA_TYPE_SIMPLE < 2) {
            if (pxVar5[1].items == (void **)name) {
              ppvVar2 = pxVar5[0xd].items;
              goto joined_r0x001c519f;
            }
          }
          else if (type == XML_SCHEMA_TYPE_ATTRIBUTEGROUP) {
            if (pxVar5[1].items == (void **)name) {
              ppvVar2 = *(void ***)&pxVar5[6].nbItems;
              goto joined_r0x001c519f;
            }
          }
          else {
            if (type != XML_SCHEMA_TYPE_GROUP) {
              return (xmlSchemaBasicItemPtr)0x0;
            }
            if (pxVar5[2].items == (void **)name) {
              ppvVar2 = *(void ***)&pxVar5[2].nbItems;
joined_r0x001c519f:
              if (ppvVar2 == (void **)nsName) {
                return (xmlSchemaBasicItemPtr)pxVar5;
              }
            }
          }
        }
        lVar6 = lVar6 + 1;
      } while (*(int *)ppvVar1 != lVar6);
    }
    pxVar7 = bucket->relations;
    if (pxVar7 != (xmlSchemaSchemaRelationPtr_conflict)0x0) {
      *(byte *)&bucket->flags = (byte)bucket->flags | 1;
      do {
        bucket_00 = pxVar7->bucket;
        if (((bucket_00 != (xmlSchemaBucketPtr_conflict)0x0) && ((bucket_00->flags & 1) == 0)) &&
           (pxVar5 = (xmlSchemaItemListPtr)xmlSchemaFindRedefCompInGraph(bucket_00,type,name,nsName)
           , pxVar5 != (xmlSchemaItemListPtr)0x0)) {
          bVar3 = false;
          goto LAB_001c51fb;
        }
        pxVar7 = pxVar7->next;
      } while (pxVar7 != (xmlSchemaSchemaRelationPtr)0x0);
      *(byte *)&bucket->flags = (byte)bucket->flags ^ 1;
      bVar3 = true;
LAB_001c51fb:
      if (!bVar3) {
        return (xmlSchemaBasicItemPtr)pxVar5;
      }
    }
  }
  return (xmlSchemaBasicItemPtr)0x0;
}

Assistant:

static xmlSchemaBasicItemPtr
xmlSchemaFindRedefCompInGraph(xmlSchemaBucketPtr bucket,
			      xmlSchemaTypeType type,
			      const xmlChar *name,
			      const xmlChar *nsName)
{
    xmlSchemaBasicItemPtr ret;
    int i;

    if ((bucket == NULL) || (name == NULL))
	return(NULL);
    if ((bucket->globals == NULL) ||
	(bucket->globals->nbItems == 0))
	goto subschemas;
    /*
    * Search in global components.
    */
    for (i = 0; i < bucket->globals->nbItems; i++) {
	ret = bucket->globals->items[i];
	if (ret->type == type) {
	    switch (type) {
		case XML_SCHEMA_TYPE_COMPLEX:
		case XML_SCHEMA_TYPE_SIMPLE:
		    if ((WXS_COMP_NAME(ret, xmlSchemaTypePtr) == name) &&
			(WXS_COMP_TNS(ret, xmlSchemaTypePtr) ==
			nsName))
		    {
			return(ret);
		    }
		    break;
		case XML_SCHEMA_TYPE_GROUP:
		    if ((WXS_COMP_NAME(ret,
			    xmlSchemaModelGroupDefPtr) == name) &&
			(WXS_COMP_TNS(ret,
			    xmlSchemaModelGroupDefPtr) == nsName))
		    {
			return(ret);
		    }
		    break;
		case XML_SCHEMA_TYPE_ATTRIBUTEGROUP:
		    if ((WXS_COMP_NAME(ret,
			    xmlSchemaAttributeGroupPtr) == name) &&
			(WXS_COMP_TNS(ret,
			    xmlSchemaAttributeGroupPtr) == nsName))
		    {
			return(ret);
		    }
		    break;
		default:
		    /* Should not be hit. */
		    return(NULL);
	    }
	}
    }
subschemas:
    /*
    * Process imported/included schemas.
    */
    if (bucket->relations != NULL) {
	xmlSchemaSchemaRelationPtr rel = bucket->relations;

	/*
	* TODO: Marking the bucket will not avoid multiple searches
	* in the same schema, but avoids at least circularity.
	*/
	bucket->flags |= XML_SCHEMA_BUCKET_MARKED;
	do {
	    if ((rel->bucket != NULL) &&
		((rel->bucket->flags & XML_SCHEMA_BUCKET_MARKED) == 0)) {
		ret = xmlSchemaFindRedefCompInGraph(rel->bucket,
		    type, name, nsName);
		if (ret != NULL)
		    return(ret);
	    }
	    rel = rel->next;
	} while (rel != NULL);
	 bucket->flags ^= XML_SCHEMA_BUCKET_MARKED;
    }
    return(NULL);
}